

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.c
# Opt level: O2

_Bool Curl_pipeline_server_blacklisted(Curl_easy *handle,char *server_name)

{
  curl_llist_element *pcVar1;
  char *__s;
  _Bool _Var2;
  int iVar3;
  curl_llist *pcVar4;
  size_t max;
  
  if ((server_name == (char *)0x0 || handle->multi == (Curl_multi *)0x0) ||
     (pcVar4 = Curl_multi_pipelining_server_bl(handle->multi), pcVar4 == (curl_llist *)0x0)) {
LAB_0050137f:
    _Var2 = false;
  }
  else {
    do {
      pcVar1 = pcVar4->head;
      if (pcVar1 == (curl_llist_element *)0x0) goto LAB_0050137f;
      __s = (char *)pcVar1->ptr;
      max = strlen(__s);
      iVar3 = Curl_strncasecompare(__s,server_name,max);
      pcVar4 = (curl_llist *)&pcVar1->next;
    } while (iVar3 == 0);
    Curl_infof(handle,"Server %s is blacklisted\n",server_name);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

bool Curl_pipeline_server_blacklisted(struct Curl_easy *handle,
                                      char *server_name)
{
  if(handle->multi && server_name) {
    struct curl_llist *blacklist =
      Curl_multi_pipelining_server_bl(handle->multi);

    if(blacklist) {
      struct curl_llist_element *curr;

      curr = blacklist->head;
      while(curr) {
        char *bl_server_name;

        bl_server_name = curr->ptr;
        if(strncasecompare(bl_server_name, server_name,
                           strlen(bl_server_name))) {
          infof(handle, "Server %s is blacklisted\n", server_name);
          return TRUE;
        }
        curr = curr->next;
      }
    }

    DEBUGF(infof(handle, "Server %s is not blacklisted\n", server_name));
  }
  return FALSE;
}